

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseSimdLane(WastParser *this,Location loc,uint64_t *lane_idx)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  TokenType TVar2;
  Result RVar3;
  char *format;
  undefined8 in_R8;
  undefined8 in_R9;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  TVar2 = Peek(this,0);
  if ((TVar2 != Last_Literal) && (TVar2 = Peek(this,0), TVar2 != Int)) {
    paVar1 = &local_88.loc.field_1;
    local_88.loc.filename._M_len = (size_t)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"a natural number in range [0, 32)","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_88,&local_88.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename._M_len == paVar1) {
      return (Result)RVar3.enum_;
    }
    operator_delete((void *)local_88.loc.filename._M_len,
                    (long)local_88.loc.field_1.field_1.offset + 1);
    return (Result)RVar3.enum_;
  }
  Consume(&local_88,this);
  if (2 < local_88.token_type_ - First_Literal) {
    __assert_fail("HasLiteral()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                  ,0x72,"const Literal &wabt::Token::literal() const");
  }
  RVar3 = ParseInt64(local_88.field_2.literal_.text._M_str,
                     local_88.field_2.literal_.text._M_str + (long)local_88.field_2.text_._M_str,
                     lane_idx,UnsignedOnly);
  if (RVar3.enum_ == Error) {
    format = "invalid literal \"%.*s\"";
  }
  else {
    if (*lane_idx < 0x100) {
      return (Result)Ok;
    }
    format = "lane index \"%.*s\" out-of-range [0, 32)";
  }
  Error(this,loc,format,local_88.field_2.literal_.text._M_len & 0xffffffff,
        local_88.field_2.literal_.text._M_str,in_R8,in_R9);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseSimdLane(Location loc, uint64_t* lane_idx) {
  if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
    return ErrorExpected({"a natural number in range [0, 32)"});
  }

  Literal literal = Consume().literal();

  Result result =
      ParseInt64(literal.text, lane_idx, ParseIntType::UnsignedOnly);

  if (Failed(result)) {
    Error(loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  // The valid range is only [0, 32), but it's only malformed if it can't
  // fit in a byte.
  if (*lane_idx > 255) {
    Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  return Result::Ok;
}